

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::isWellFormedIPv4Address(XMLCh *addr,XMLSize_t length)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  
  uVar3 = 0;
  bVar6 = length == 0;
  if (!bVar6) {
    iVar5 = 0;
    uVar4 = 1;
    do {
      uVar2 = uVar3;
      if (addr[uVar4 - 1] == L'.') {
        if ((uVar4 == 1) || ((uVar4 == length || (bVar1 = XMLString::isDigit(addr[uVar4]), !bVar1)))
           ) break;
        uVar2 = uVar3 + 1;
        iVar5 = 0;
        if (2 < (int)uVar3) break;
      }
      else {
        bVar1 = XMLString::isDigit(addr[uVar4 - 1]);
        if ((2 < iVar5) || (!bVar1)) break;
        iVar5 = iVar5 + 1;
        if (iVar5 == 3) {
          iVar5 = 3;
          if ((0x31 < (ushort)addr[uVar4 - 3]) &&
             ((addr[uVar4 - 3] != L'2' ||
              ((0x34 < (ushort)addr[uVar4 - 2] &&
               ((addr[uVar4 - 2] != L'5' || (0x35 < (ushort)addr[uVar4 - 1])))))))) break;
        }
      }
      bVar6 = length <= uVar4;
      bVar1 = uVar4 != length;
      uVar4 = uVar4 + 1;
      uVar3 = uVar2;
    } while (bVar1);
    uVar3 = (uint)(byte)(uVar2 == 3 & bVar6);
  }
  return SUB41(uVar3,0);
}

Assistant:

bool XMLUri::isWellFormedIPv4Address(const XMLCh* const addr, const XMLSize_t length)
{
    int numDots = 0;
    int numDigits = 0;

    // IPv4address = 1*3DIGIT "." 1*3DIGIT "." 1*3DIGIT "." 1*3DIGIT
    //
    // make sure that
    // 1) we see only digits and dot separators,
    // 2) that any dot separator is preceded and followed by a digit
    // 3) that we find 3 dots
    // 4) that each segment contains 1 to 3 digits.
    // 5) that each segment is not greater than 255.
    for (XMLSize_t i = 0; i < length; ++i)
    {
        if (addr[i] == chPeriod)
        {
            if ((i == 0) ||
                (i+1 == length) ||
                !XMLString::isDigit(addr[i+1]))
            {
               return false;
            }
            numDigits = 0;
            if (++numDots > 3)
                return false;
        }
        else if (!XMLString::isDigit(addr[i]))
        {
            return false;
        }
        // Check that that there are no more than three digits
        // in this segment.
        else if (++numDigits > 3)
        {
            return false;
        }
        // Check that this segment is not greater than 255.
        else if (numDigits == 3)
        {
            XMLCh first = addr[i-2];
            XMLCh second = addr[i-1];
            XMLCh last = addr[i];
            if (!(first < chDigit_2 ||
                 (first == chDigit_2 &&
                 (second < chDigit_5 ||
                 (second == chDigit_5 && last <= chDigit_5)))))
            {
                return false;
            }
        }
    } //for
    return (numDots == 3);
}